

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  Curl_easy *pCVar1;
  conncache *h;
  long lVar2;
  bool bVar3;
  int iVar4;
  connectbundle *pcVar5;
  connectbundle *cb_ptr;
  curl_llist *pcVar6;
  ulong uVar7;
  char *__s;
  size_t key_len;
  CURLcode CVar8;
  void *pvVar9;
  
  pCVar1 = conn->data;
  pcVar5 = Curl_conncache_find_bundle(conn,(pCVar1->state).conn_cache);
  if (pcVar5 != (connectbundle *)0x0) {
    cb_ptr = (connectbundle *)0x0;
    goto LAB_00144261;
  }
  cb_ptr = (connectbundle *)(*Curl_cmalloc)(0x18);
  pvVar9 = (void *)0x1b;
  bVar3 = false;
  if (cb_ptr != (connectbundle *)0x0) {
    cb_ptr->num_connections = 0;
    cb_ptr->multiuse = 0;
    pcVar6 = Curl_llist_alloc(conn_llist_dtor);
    cb_ptr->conn_list = pcVar6;
    bVar3 = true;
    if (pcVar6 == (curl_llist *)0x0) {
      (*Curl_cfree)(cb_ptr);
      cb_ptr = (connectbundle *)0x0;
      bVar3 = false;
    }
    else {
      pvVar9 = (void *)0x0;
    }
  }
  if (bVar3) {
    uVar7 = 0x100;
    if ((conn->bits).proxy == false) {
      uVar7 = (ulong)(conn->bits).conn_to_host << 5 | 0xc0;
    }
    __s = curl_maprintf("%s:%d",*(undefined8 *)((conn->chunk).hexbuffer + (uVar7 - 8)),conn->port);
    if (__s == (char *)0x0) {
LAB_0014424b:
      bundle_destroy(cb_ptr);
      pvVar9 = (void *)0x1b;
      goto LAB_00144258;
    }
    h = (pCVar1->state).conn_cache;
    key_len = strlen(__s);
    pvVar9 = Curl_hash_add(&h->hash,__s,key_len,cb_ptr);
    (*Curl_cfree)(__s);
    if (pvVar9 == (void *)0x0) goto LAB_0014424b;
    bVar3 = true;
    pcVar5 = cb_ptr;
  }
  else {
LAB_00144258:
    pcVar5 = (connectbundle *)0x0;
    bVar3 = false;
  }
  if (!bVar3) {
    return (CURLcode)pvVar9;
  }
LAB_00144261:
  iVar4 = Curl_llist_insert_next(pcVar5->conn_list,pcVar5->conn_list->tail,conn);
  if (iVar4 == 0) {
    CVar8 = CURLE_OUT_OF_MEMORY;
    if (cb_ptr != (connectbundle *)0x0) {
      conncache_remove_bundle((pCVar1->state).conn_cache,cb_ptr);
    }
  }
  else {
    conn->bundle = pcVar5;
    pcVar5->num_connections = pcVar5->num_connections + 1;
    lVar2 = connc->next_connection_id;
    connc->next_connection_id = lVar2 + 1;
    conn->connection_id = lVar2;
    connc->num_connections = connc->num_connections + 1;
    CVar8 = CURLE_OK;
  }
  return CVar8;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct Curl_easy *data = conn->data;

  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache);
  if(!bundle) {
    char *key;
    int rc;

    result = bundle_create(data, &new_bundle);
    if(result)
      return result;

    key = hashkey(conn);
    if(!key) {
      bundle_destroy(new_bundle);
      return CURLE_OUT_OF_MEMORY;
    }

    rc = conncache_add_bundle(data->state.conn_cache, key, new_bundle);
    free(key);
    if(!rc) {
      bundle_destroy(new_bundle);
      return CURLE_OUT_OF_MEMORY;
    }
    bundle = new_bundle;
  }

  result = bundle_add_conn(bundle, conn);
  if(result) {
    if(new_bundle)
      conncache_remove_bundle(data->state.conn_cache, new_bundle);
    return result;
  }

  conn->connection_id = connc->next_connection_id++;
  connc->num_connections++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %" CURL_FORMAT_CURL_OFF_TU " members\n",
               conn->connection_id, (curl_off_t) connc->num_connections));

  return CURLE_OK;
}